

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_char,unsigned_char(*&)(unsigned_char,unsigned_char)>
          (Memory *this,u64 offset,u64 addend,uchar rhs,
          BinopFunc<unsigned_char,_unsigned_char> **func,uchar *out)

{
  uchar uVar1;
  pointer puVar2;
  pointer puVar3;
  uchar uVar4;
  ulong uVar5;
  Enum EVar6;
  ulong uVar7;
  
  puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar3 - (long)puVar2;
  uVar7 = addend + offset + 1;
  EVar6 = Error;
  if ((((uVar7 <= uVar5) && (puVar3 != puVar2)) && (offset <= uVar5)) && (addend <= uVar5)) {
    uVar1 = puVar2[addend + offset];
    uVar4 = (**func)(uVar1,rhs);
    puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    uVar5 = (long)puVar3 - (long)puVar2;
    if (((uVar7 <= uVar5) && (puVar3 != puVar2)) && ((offset <= uVar5 && (addend <= uVar5)))) {
      puVar2[addend + offset] = uVar4;
      *out = uVar1;
      EVar6 = Ok;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}